

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CX.hpp
# Opt level: O2

void __thiscall qclab::qgates::CX<std::complex<double>_>::CX(CX<std::complex<double>_> *this)

{
  (this->super_QControlledGate2<std::complex<double>_>).control_ = 0;
  (this->super_QControlledGate2<std::complex<double>_>).controlState_ = 1;
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_001215e8;
  std::make_unique<qclab::qgates::PauliX<std::complex<double>>,int>((int *)&this->gate_);
  return;
}

Assistant:

CX()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< PauliX< T > >( 1 ) )
        { }